

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

int mbedtls_entropy_update_seed_file(mbedtls_entropy_context *ctx,char *path)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  size_t sVar3;
  size_t __n;
  uchar buf [1024];
  uchar auStack_438 [1032];
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -0x3f;
  }
  else {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    fseek(__stream,0,0);
    __n = 0x400;
    if (uVar2 < 0x400) {
      __n = uVar2;
    }
    sVar3 = fread(auStack_438,1,__n,__stream);
    iVar1 = -0x3f;
    if (sVar3 == __n) {
      iVar1 = entropy_update(ctx,'\x14',auStack_438,__n);
    }
    fclose(__stream);
    mbedtls_platform_zeroize(auStack_438,0x400);
    if (iVar1 == 0) {
      iVar1 = mbedtls_entropy_write_seed_file(ctx,path);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_entropy_update_seed_file( mbedtls_entropy_context *ctx, const char *path )
{
    int ret = 0;
    FILE *f;
    size_t n;
    unsigned char buf[ MBEDTLS_ENTROPY_MAX_SEED_SIZE ];

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    n = (size_t) ftell( f );
    fseek( f, 0, SEEK_SET );

    if( n > MBEDTLS_ENTROPY_MAX_SEED_SIZE )
        n = MBEDTLS_ENTROPY_MAX_SEED_SIZE;

    if( fread( buf, 1, n, f ) != n )
        ret = MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR;
    else
        ret = mbedtls_entropy_update_manual( ctx, buf, n );

    fclose( f );

    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    if( ret != 0 )
        return( ret );

    return( mbedtls_entropy_write_seed_file( ctx, path ) );
}